

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

size_t portability_path_get_module_name
                 (char *path,size_t path_size,char *extension,size_t extension_size,char *name,
                 size_t name_size)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  
  if (name == (char *)0x0 || (extension == (char *)0x0 || path == (char *)0x0)) {
    return 0;
  }
  if (extension_size <= path_size) {
    lVar4 = -1;
    do {
      if ((-lVar4 == extension_size) || (-lVar4 == path_size)) {
        sVar3 = portability_path_get_name(path,path_size,name,name_size);
        return sVar3;
      }
      lVar1 = lVar4 + extension_size;
      lVar2 = lVar4 + path_size;
      lVar4 = lVar4 + -1;
    } while (extension[lVar1] == path[lVar2]);
  }
  sVar3 = portability_path_get_fullname(path,path_size,name,name_size);
  return sVar3;
}

Assistant:

size_t portability_path_get_module_name(const char *path, size_t path_size, const char *extension, size_t extension_size, char *name, size_t name_size)
{
	if (path == NULL || extension == NULL || name == NULL)
	{
		return 0;
	}

	if (path_size < extension_size)
	{
		return portability_path_get_fullname(path, path_size, name, name_size);
	}

	size_t i, j;

	for (i = extension_size - 1, j = path_size - 1; i > 0 && j > 0; --i, --j)
	{
		if (extension[i] != path[j])
		{
			return portability_path_get_fullname(path, path_size, name, name_size);
		}
	}

	return portability_path_get_name(path, path_size, name, name_size);
}